

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O0

int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  Kit_DsdObj_t *pKVar3;
  Kit_DsdObj_t *pKVar4;
  int local_34;
  int i;
  Kit_DsdObj_t *pObj1;
  Kit_DsdObj_t *pObj0;
  int iLit1_local;
  int iLit0_local;
  Kit_DsdNtk_t *p_local;
  
  iVar1 = Abc_LitIsCompl(iLit0);
  if (iVar1 != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0x108,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
  }
  iVar1 = Abc_LitIsCompl(iLit1);
  if (iVar1 != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0x109,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
  }
  iVar1 = Abc_Lit2Var(iLit0);
  pKVar3 = Kit_DsdNtkObj(p,iVar1);
  iVar1 = Abc_Lit2Var(iLit1);
  pKVar4 = Kit_DsdNtkObj(p,iVar1);
  if ((pKVar3 == (Kit_DsdObj_t *)0x0) && (pKVar4 == (Kit_DsdObj_t *)0x0)) {
    p_local._4_4_ = 1;
  }
  else if ((pKVar3 == (Kit_DsdObj_t *)0x0) || (pKVar4 == (Kit_DsdObj_t *)0x0)) {
    p_local._4_4_ = 0;
  }
  else if (((uint)*pKVar3 >> 6 & 7) == ((uint)*pKVar4 >> 6 & 7)) {
    if ((uint)*pKVar3 >> 0x1a == (uint)*pKVar4 >> 0x1a) {
      if (((uint)*pKVar3 >> 6 & 7) == 5) {
        p_local._4_4_ = 0;
      }
      else {
        if ((((uint)*pKVar3 >> 6 & 7) != 3) && (((uint)*pKVar3 >> 6 & 7) != 4)) {
          __assert_fail("pObj0->Type == KIT_DSD_AND || pObj0->Type == KIT_DSD_XOR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0x116,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
        }
        for (local_34 = 0; local_34 < (int)((uint)*pKVar3 >> 0x1a); local_34 = local_34 + 1) {
          iVar1 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar3[1].field_0x0 + (long)local_34 * 2));
          iVar2 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)local_34 * 2));
          if (iVar1 != iVar2) {
            return 0;
          }
          iVar1 = Abc_LitRegular((uint)*(ushort *)(&pKVar3[1].field_0x0 + (long)local_34 * 2));
          iVar2 = Abc_LitRegular((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)local_34 * 2));
          iVar1 = Amap_CreateCheckEqual_rec(p,iVar1,iVar2);
          if (iVar1 == 0) {
            return 0;
          }
        }
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Amap_CreateCheckEqual_rec( Kit_DsdNtk_t * p, int iLit0, int iLit1 )
{
    Kit_DsdObj_t * pObj0, * pObj1; 
    int i;
    assert( !Abc_LitIsCompl(iLit0) );
    assert( !Abc_LitIsCompl(iLit1) );
    pObj0 = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit0) );
    pObj1 = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit1) );
    if ( pObj0 == NULL && pObj1 == NULL )
        return 1;
    if ( pObj0 == NULL || pObj1 == NULL )
        return 0;
    if ( pObj0->Type != pObj1->Type )
        return 0;
    if ( pObj0->nFans != pObj1->nFans )
        return 0;
    if ( pObj0->Type == KIT_DSD_PRIME )
        return 0;
    assert( pObj0->Type == KIT_DSD_AND || pObj0->Type == KIT_DSD_XOR );
    for ( i = 0; i < (int)pObj0->nFans; i++ )
    {
        if ( Abc_LitIsCompl(pObj0->pFans[i]) != Abc_LitIsCompl(pObj1->pFans[i]) )
            return 0;
        if ( !Amap_CreateCheckEqual_rec( p, Abc_LitRegular(pObj0->pFans[i]), Abc_LitRegular(pObj1->pFans[i]) ) )
            return 0;
    }
    return 1;
}